

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsip.cpp
# Opt level: O2

time_t __thiscall tsip::get_gps_time_utc(tsip *this)

{
  uint uVar1;
  undefined1 auVar2 [13];
  _command_packet _cmd;
  _command_packet _cmd_00;
  undefined1 auVar3 [13];
  bool bVar4;
  time_t tVar5;
  long lVar6;
  long lVar7;
  _command_packet *p_Var8;
  UINT8 *pUVar9;
  byte bVar10;
  undefined4 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5c [64];
  undefined1 local_58 [16];
  uint local_48;
  uint local_44;
  undefined8 local_40;
  int local_38;
  char *local_28;
  
  bVar10 = 0;
  *(undefined2 *)&this->m_command = 0xa28e;
  (this->m_command).raw.data[2] = '\x03';
  (this->m_command).raw.cmd_len = '\x03';
  lVar7 = 0x44;
  p_Var8 = &this->m_command;
  pUVar9 = &stack0xffffffffffffff58;
  for (lVar6 = lVar7; lVar6 != 0; lVar6 = lVar6 + -1) {
    *pUVar9 = (p_Var8->raw).data[0];
    p_Var8 = (_command_packet *)((long)p_Var8 + 1);
    pUVar9 = pUVar9 + 1;
  }
  _cmd._4_64_ = in_stack_ffffffffffffff5c;
  _cmd._0_4_ = in_stack_ffffffffffffff58;
  send_request_msg(this,_cmd);
  *(undefined2 *)&this->m_command = 0xab8e;
  (this->m_command).raw.cmd_len = '\x02';
  p_Var8 = &this->m_command;
  pUVar9 = &stack0xffffffffffffff58;
  for (; lVar7 != 0; lVar7 = lVar7 + -1) {
    *pUVar9 = (p_Var8->raw).data[0];
    p_Var8 = (_command_packet *)((long)p_Var8 + (ulong)bVar10 * -2 + 1);
    pUVar9 = pUVar9 + (ulong)bVar10 * -2 + 1;
  }
  _cmd_00._4_64_ = in_stack_ffffffffffffff5c;
  _cmd_00._0_4_ = in_stack_ffffffffffffff58;
  bVar4 = get_report_msg(this,_cmd_00);
  if (bVar4) {
    local_28 = "UTC";
    local_40._0_4_ = -1;
    local_40._4_4_ = -1;
    local_38 = -1;
    local_44 = (this->m_primary_time).report.year - 0x76c;
    local_48 = (this->m_primary_time).report.month - 1;
    uVar1._0_1_ = (this->m_primary_time).report.seconds;
    uVar1._1_1_ = (this->m_primary_time).report.minutes;
    uVar1._2_1_ = (this->m_primary_time).report.hours;
    uVar1._3_1_ = (this->m_primary_time).report.day;
    auVar2[0xc] = uVar1._3_1_;
    auVar2._0_12_ = ZEXT712(0);
    auVar3[1] = 0;
    auVar3[0] = uVar1._2_1_;
    auVar3._2_3_ = auVar2._10_3_;
    auVar3._5_8_ = 0;
    local_58[5] = 0;
    local_58[4] = uVar1._1_1_;
    local_58._6_7_ = SUB137(auVar3 << 0x40,6);
    local_58._0_4_ = uVar1 & 0xff;
    local_58._13_3_ = 0;
    tVar5 = timegm((tm *)local_58);
    this->gps_time = tVar5;
    if (this->verbose == true) {
      printf("Got GPS time Year: %d, Month: %d, Day: %d, Hour: %d, Minutes: %d, Seconds: %d\n",
             (ulong)local_44,(ulong)local_48,(ulong)(uint)local_58._12_4_,
             (ulong)(uint)local_58._8_4_,(ulong)(uint)local_58._4_4_);
      printf("seconds: %d\n",this->gps_time);
      tVar5 = this->gps_time;
    }
    return tVar5;
  }
  puts("****Failed to get GPS time****");
  exit(0);
}

Assistant:

time_t tsip::get_gps_time_utc() {
	bool rc;

	//build a2 request - set UTC
	m_command.extended.code = COMMAND_SUPER_PACKET;
	m_command.extended.subcode = REPORT_SUPER_UTC_GPS_TIME;
	m_command.extended.data[0] = 0x3;
	m_command.extended.cmd_len = 3;

	rc = send_request_msg(m_command);

	//build ab request - request time packet
	m_command.extended.code = COMMAND_SUPER_PACKET;
	m_command.extended.subcode = REPORT_SUPER_PRIMARY_TIME;
	m_command.extended.cmd_len  = 2;
	rc = get_report_msg(m_command);
	if (!rc) {
		printf("****Failed to get GPS time****\n");
		exit (false);
    }


	struct tm time;

    time.tm_zone = "UTC";
    time.tm_wday = -1;
    time.tm_yday = -1;
    time.tm_isdst = -1;
    time.tm_year = m_primary_time.report.year - 1900;
    time.tm_mon = m_primary_time.report.month - 1;
    time.tm_mday = m_primary_time.report.day;
    time.tm_hour = m_primary_time.report.hours;
    time.tm_min = m_primary_time.report.minutes;
    time.tm_sec = m_primary_time.report.seconds;

    gps_time = timegm(&time);
    if (verbose) {
		printf("Got GPS time Year: %d, Month: %d, Day: %d, Hour: %d, Minutes: %d, Seconds: %d\n", time.tm_year, time.tm_mon, time.tm_mday, time.tm_hour, time.tm_min, time.tm_sec);
		printf("seconds: %d\n", gps_time);
    }

	return gps_time;
}